

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void add_upvalue_for_ENV(ParserState *parser)

{
  C_MemoryAllocator *pCVar1;
  LuaSymbol *symbol;
  AstNode *var_function;
  AstNode *current_function;
  _Bool is_local;
  _Bool local_9;
  
  local_9 = false;
  symbol = search_for_variable(parser,parser->compiler_state->_ENV,&local_9);
  if (symbol == (LuaSymbol *)0x0) {
    pCVar1 = parser->compiler_state->allocator;
    symbol = (LuaSymbol *)(*pCVar1->calloc)(pCVar1->arena,1,0x48);
    symbol->symbol_type = SYM_ENV;
    (symbol->field_1).variable.var_name = parser->compiler_state->_ENV;
    (symbol->field_1).variable.block = (Scope *)0x0;
    (symbol->field_1).variable.value_type.type_code = RAVI_TTABLE;
    (symbol->field_1).label.block = (Scope *)0x0;
    current_function = parser->current_function;
    var_function = (AstNode *)0x0;
  }
  else {
    if ((local_9 != false) || (symbol->symbol_type != SYM_LOCAL)) {
      if (symbol->symbol_type == SYM_UPVALUE) {
        var_function = (symbol->field_1).upvalue.target_variable_function;
        current_function = parser->current_function;
        if (var_function != current_function) {
          symbol = (symbol->field_1).upvalue.target_variable;
          goto LAB_0010f9f8;
        }
      }
      return;
    }
    current_function = parser->current_function;
    var_function = ((symbol->field_1).variable.block)->function;
  }
LAB_0010f9f8:
  add_upvalue_in_levels_upto(parser,current_function,var_function,symbol);
  return;
}

Assistant:

static void add_upvalue_for_ENV(ParserState *parser)
{
	bool is_local = false;
	LuaSymbol *symbol = search_for_variable(parser, parser->compiler_state->_ENV, &is_local);
	if (symbol == NULL) {
		// No definition of _ENV found
		// Create special symbol for _ENV - so that upvalues can reference it
		// Note that this symbol is not added to any scope, however upvalue created below will reference it
		CompilerState *compiler_state = parser->compiler_state;
		symbol = (LuaSymbol *) compiler_state->allocator->calloc(compiler_state->allocator->arena, 1, sizeof(LuaSymbol));
		symbol->symbol_type = SYM_ENV;
		symbol->variable.var_name = parser->compiler_state->_ENV;
		symbol->variable.block = NULL;
		set_type(&symbol->variable.value_type, RAVI_TTABLE); // _ENV is by default a table
		// Create an upvalue for _ENV
		add_upvalue_in_levels_upto(parser, parser->current_function, NULL, symbol);
	} else if (!is_local && symbol->symbol_type == SYM_LOCAL) {
		// If _ENV occurred as a local symbol in a parent function then we
		// need to construct an upvalue. Lua requires that the upvalue be
		// added to all functions in the tree up to the function where the local
		// is defined.
		add_upvalue_in_levels_upto(parser, parser->current_function, symbol->variable.block->function, symbol);
	} else if (symbol->symbol_type == SYM_UPVALUE && symbol->upvalue.target_variable_function != parser->current_function) {
		// We found an upvalue but it is not at the same level
		// Ensure all levels have the upvalue
		// Note that if the upvalue refers to special _ENV symbol then target function will be NULL
		add_upvalue_in_levels_upto(parser, parser->current_function, symbol->upvalue.target_variable_function,
					   symbol->upvalue.target_variable);
	}
}